

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

SimpleString __thiscall
TestFailure::createDifferenceAtPosString
          (TestFailure *this,SimpleString *actual,size_t position,DifferenceFormat format)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  int in_R8D;
  SimpleString result;
  SimpleString markString;
  SimpleString differentString;
  SimpleString actualString;
  SimpleString paddingForPreventingOutOfBounds;
  SimpleString local_60;
  SimpleString local_58;
  SimpleString local_50;
  SimpleString local_48;
  SimpleString local_40;
  SimpleString local_38;
  
  sVar4 = CONCAT44(in_register_0000000c,format);
  SimpleString::SimpleString((SimpleString *)this,"");
  sVar3 = sVar4 * 3 + 1;
  if (in_R8D == 0) {
    sVar3 = sVar4;
  }
  SimpleString::SimpleString(&local_40," ",10);
  SimpleString::operator+(&local_50,&local_40);
  SimpleString::operator+(&local_48,&local_50);
  SimpleString::~SimpleString(&local_50);
  StringFromFormat((char *)&local_50,"difference starts at position %lu at: <",sVar4);
  SimpleString::operator+=((SimpleString *)this,"\n");
  pcVar1 = SimpleString::asCharString(&local_50);
  SimpleString::subString(&local_60,(size_t)&local_48,sVar3);
  pcVar2 = SimpleString::asCharString(&local_60);
  StringFromFormat((char *)&local_58,"\t%s%s>\n",pcVar1,pcVar2);
  SimpleString::operator+=((SimpleString *)this,&local_58);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_60);
  SimpleString::subString(&local_58,(size_t)&local_48,sVar3);
  sVar3 = SimpleString::size(&local_58);
  pcVar1 = (char *)(*PlatformSpecificMalloc)(sVar3 + 1);
  SimpleString::copyToBuffer(&local_58,pcVar1,sVar3 + 1);
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      if (1 < (byte)(pcVar1[sVar4] - 9U)) {
        pcVar1[sVar4] = ' ';
      }
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  SimpleString::SimpleString(&local_60,pcVar1);
  (*PlatformSpecificFree)(pcVar1);
  SimpleString::operator=(&local_58,&local_60);
  SimpleString::~SimpleString(&local_60);
  sVar3 = SimpleString::size(&local_58);
  pcVar1 = (char *)(*PlatformSpecificMalloc)(sVar3 + 1);
  SimpleString::copyToBuffer(&local_58,pcVar1,sVar3 + 1);
  pcVar1[10] = '^';
  SimpleString::SimpleString(&local_60,pcVar1);
  (*PlatformSpecificFree)(pcVar1);
  SimpleString::operator=(&local_58,&local_60);
  SimpleString::~SimpleString(&local_60);
  sVar3 = SimpleString::size(&local_50);
  SimpleString::SimpleString(&local_38," ",sVar3);
  pcVar1 = SimpleString::asCharString(&local_38);
  pcVar2 = SimpleString::asCharString(&local_58);
  StringFromFormat((char *)&local_60,"\t%s%s",pcVar1,pcVar2);
  SimpleString::operator+=((SimpleString *)this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_40);
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString TestFailure::createDifferenceAtPosString(const SimpleString& actual, size_t position, DifferenceFormat format)
{
    SimpleString result;
    const size_t extraCharactersWindow = 20;
    const size_t halfOfExtraCharactersWindow = extraCharactersWindow / 2;
    const size_t actualOffset = (format == DIFFERENCE_STRING) ? position : (position * 3 + 1);

    SimpleString paddingForPreventingOutOfBounds (" ", halfOfExtraCharactersWindow);
    SimpleString actualString = paddingForPreventingOutOfBounds + actual + paddingForPreventingOutOfBounds;
    SimpleString differentString = StringFromFormat("difference starts at position %lu at: <", (unsigned long) position);

    result += "\n";
    result += StringFromFormat("\t%s%s>\n", differentString.asCharString(), actualString.subString(actualOffset, extraCharactersWindow).asCharString());

    SimpleString markString = actualString.subString(actualOffset, halfOfExtraCharactersWindow+1);
    markString = removeAllPrintableCharactersFrom(markString);
    markString = addMarkerToString(markString, halfOfExtraCharactersWindow);

    result += StringFromFormat("\t%s%s", SimpleString(" ", differentString.size()).asCharString(), markString.asCharString());
    return result;
}